

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O1

PartialJointPolicyDiscretePure * __thiscall
BayesianGameForDecPOMDPStage::ConstructExtendedPolicy
          (BayesianGameForDecPOMDPStage *this,PartialJointPolicyDiscretePure *jpolPrevTs,
          JointPolicyDiscretePure *jpolBG,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrOHts,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *firstOHtsI)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  PartialJointPolicyPureVector *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  E *this_01;
  ulong uVar4;
  ulong uVar5;
  
  if ((jpolPrevTs->super_JointPolicyDiscretePure).super_JointPolicyDiscrete._m_indexDomCat ==
      OHIST_INDEX) {
    if ((jpolBG->super_JointPolicyDiscrete)._m_indexDomCat == TYPE_INDEX) {
      this_00 = (PartialJointPolicyPureVector *)operator_new(0x88);
      PartialJointPolicyPureVector::PartialJointPolicyPureVector(this_00,jpolPrevTs);
      (*(this_00->super_PartialJointPolicyDiscretePure).super_JointPolicyDiscretePure.
        super_JointPolicyDiscrete.super_JointPolicy._vptr_JointPolicy[2])
                (this_00,(this_00->super_PartialJointPolicyDiscretePure).
                         super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy.
                         _m_depth + 1);
      iVar2 = (*(this->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface
                .super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
                super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3])
                        (&this->super_BayesianGameIdenticalPayoff);
      if (CONCAT44(extraout_var,iVar2) != 0) {
        uVar4 = 0;
        do {
          if ((nrOHts->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar4] != 0) {
            uVar5 = 0;
            do {
              uVar1 = (firstOHtsI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start[uVar4];
              uVar3 = (*(jpolBG->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy
                        [0x13])(jpolBG,uVar4,uVar5);
              (*(this_00->super_PartialJointPolicyDiscretePure).super_JointPolicyDiscretePure.
                super_JointPolicyDiscrete.super_JointPolicy._vptr_JointPolicy[0x10])
                        (this_00,uVar4,(ulong)(uVar1 + (int)uVar5),(ulong)uVar3);
              uVar5 = (ulong)((int)uVar5 + 1);
            } while (uVar5 < (nrOHts->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar4]);
          }
          uVar4 = (ulong)((int)uVar4 + 1);
          iVar2 = (*(this->super_BayesianGameIdenticalPayoff).
                    super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
                    super_Interface_ProblemToPolicyDiscretePure.
                    super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete
                    [3])();
        } while (uVar4 < CONCAT44(extraout_var_00,iVar2));
      }
      return &this_00->super_PartialJointPolicyDiscretePure;
    }
    this_01 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_01,
         "BayesianGameForDecPOMDPStage::ConstructExtendedPolicy --- jpolPrevTs.GetPolicyDomainCategory() != PolicyGlobals::TYPE_INDEX "
        );
  }
  else {
    this_01 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_01,
         "BayesianGameForDecPOMDPStage::ConstructExtendedPolicy --- jpolPrevTs.GetPolicyDomainCategory() != PolicyGlobals::OHIST_INDEX "
        );
  }
  __cxa_throw(this_01,&E::typeinfo,E::~E);
}

Assistant:

PartialJointPolicyDiscretePure* 
BayesianGameForDecPOMDPStage::ConstructExtendedPolicy(
        PartialJointPolicyDiscretePure& jpolPrevTs, 
        JointPolicyDiscretePure& jpolBG, 
        vector<size_t>& nrOHts, 
        vector<Index>& firstOHtsI
        )
{
    //check policy types
    if(jpolPrevTs.GetPolicyDomainCategory() != PolicyGlobals::OHIST_INDEX)
        throw E("BayesianGameForDecPOMDPStage::ConstructExtendedPolicy --- jpolPrevTs.GetPolicyDomainCategory() != PolicyGlobals::OHIST_INDEX ");
    if(jpolBG.GetPolicyDomainCategory() != PolicyGlobals::TYPE_INDEX)
        throw E("BayesianGameForDecPOMDPStage::ConstructExtendedPolicy --- jpolPrevTs.GetPolicyDomainCategory() != PolicyGlobals::TYPE_INDEX ");
    //construct a policy for the DecPOMDP: 
    //a copy of jpolPrevTs with extended to this time step (ts) by 
    //jpolBG
    PartialJointPolicyDiscretePure* jpolTs = new 
        PartialJointPolicyPureVector(jpolPrevTs);
    jpolTs->SetDepth( jpolTs->GetDepth()+1 );
    for(Index agentI=0; agentI < GetNrAgents(); agentI++)
    {
        for(Index type = 0; type < nrOHts[agentI]; type++)
        {
            Index ohI = type + firstOHtsI[agentI];
            jpolTs->SetAction(agentI, ohI, 
                    jpolBG.GetActionIndex(agentI, type) );
        }         
    }
    return(jpolTs);
}